

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunk_iterator.hpp
# Opt level: O1

void __thiscall
burst::buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned_int>,_int>::
buffered_chunk_iterator
          (buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned_int>,_int> *this,
          _Fwd_list_const_iterator<unsigned_int> first,_Fwd_list_const_iterator<unsigned_int> last,
          int chunk_size)

{
  element_type *peVar1;
  ulong uVar2;
  
  (this->m_current)._M_node = first._M_node;
  (this->m_end)._M_node = last._M_node;
  this->m_chunk_size = (long)chunk_size;
  uVar2 = 0xffffffffffffffff;
  if (-1 < chunk_size) {
    uVar2 = (long)chunk_size * 4;
  }
  peVar1 = (element_type *)operator_new__(uVar2);
  (this->m_chunk).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_int*,std::default_delete<unsigned_int[]>,std::allocator<void>,void>
            (&(this->m_chunk).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,peVar1);
  this->m_chunk_end =
       (this->m_chunk).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (0 < this->m_chunk_size) {
    increment(this);
    return;
  }
  __assert_fail("m_chunk_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/buffered_chunk_iterator.hpp"
                ,0x4f,
                "burst::buffered_chunk_iterator<std::_Fwd_list_const_iterator<unsigned int>, int>::buffered_chunk_iterator(Iterator, Iterator, Integral) [Iterator = std::_Fwd_list_const_iterator<unsigned int>, Integral = int]"
               );
}

Assistant:

buffered_chunk_iterator (Iterator first, Iterator last, Integral chunk_size):
            m_current(first),
            m_end(last),
            m_chunk_size(static_cast<difference_type>(chunk_size)),
            m_chunk
            (
                std::shared_ptr<buffer_value_type>
                (
                    new buffer_value_type[static_cast<std::size_t>(m_chunk_size)],
                    std::default_delete<buffer_value_type[]>{}
                )
            ),
            m_chunk_end(m_chunk.get())
        {
            assert(m_chunk_size > 0);
            increment();
        }